

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

void __thiscall
pstd::vector<pbrt::Point2<float>,_pstd::pmr::polymorphic_allocator<pbrt::Point2<float>_>_>::reserve
          (vector<pbrt::Point2<float>,_pstd::pmr::polymorphic_allocator<pbrt::Point2<float>_>_>
           *this,size_t n)

{
  int i;
  Point2<float> *pPVar1;
  ulong uVar2;
  
  if (this->nAlloc < n) {
    pPVar1 = pmr::polymorphic_allocator<pbrt::Point2<float>>::allocate_object<pbrt::Point2<float>>
                       ((polymorphic_allocator<pbrt::Point2<float>> *)this,n);
    for (uVar2 = 0; uVar2 < this->nStored; uVar2 = uVar2 + 1) {
      pPVar1[uVar2].super_Tuple2<pbrt::Point2,_float> =
           this->ptr[uVar2].super_Tuple2<pbrt::Point2,_float>;
    }
    pmr::polymorphic_allocator<pbrt::Point2<float>>::deallocate_object<pbrt::Point2<float>>
              ((polymorphic_allocator<pbrt::Point2<float>> *)this,this->ptr,this->nAlloc);
    this->nAlloc = n;
    this->ptr = pPVar1;
  }
  return;
}

Assistant:

void reserve(size_t n) {
        if (nAlloc >= n)
            return;

        T *ra = alloc.template allocate_object<T>(n);
        for (int i = 0; i < nStored; ++i) {
            alloc.template construct<T>(ra + i, std::move(begin()[i]));
            alloc.destroy(begin() + i);
        }

        alloc.deallocate_object(ptr, nAlloc);
        nAlloc = n;
        ptr = ra;
    }